

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server_test.cxx
# Opt level: O2

int raft_server_test::add_node_error_cases_test(void)

{
  _func_int **pp_Var1;
  _func_int *p_Var2;
  ptr<buffer> *ppVar3;
  element_type *peVar4;
  int iVar5;
  cmd_result_code cVar6;
  ostream *poVar7;
  int __how;
  int __how_00;
  int __how_01;
  ulong uVar8;
  int __fd;
  string *psVar9;
  vector<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
  *configs_out;
  initializer_list<RaftPkg_*> __l;
  atomic<bool> invoked;
  ptr<srv_config> srv;
  undefined1 local_5a8 [16];
  ptr<req_msg> req;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_588;
  ptr<log_entry> log;
  ptr<buffer> buf;
  ptr<log_entry> log_1;
  undefined1 local_534 [4];
  ptr<FakeNetwork> c_net;
  undefined1 local_51c [4];
  ptr<log_entry> log_2;
  ptr<FakeNetworkBase> f_base;
  vector<RaftPkg_*,_std::allocator<RaftPkg_*>_> pkgs;
  _Any_data local_4e0;
  atomic<unsigned_long> local_4d0;
  code *local_4c8;
  __atomic_base<unsigned_long> local_4c0;
  __atomic_base<unsigned_long> local_4b8;
  undefined4 local_4ac;
  string s1_addr;
  string s2_addr;
  undefined1 local_468 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_450;
  undefined1 local_448 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_440;
  undefined1 local_438 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_430;
  string s3_addr;
  RaftPkg s1;
  RaftPkg s3;
  RaftPkg s2;
  
  raft_functional_common::reset_log_files();
  std::make_shared<nuraft::FakeNetworkBase>();
  std::__cxx11::string::string((string *)&s1_addr,"S1",(allocator *)&s1);
  std::__cxx11::string::string((string *)&s2_addr,"S2",(allocator *)&s1);
  std::__cxx11::string::string((string *)&s3_addr,"S3",(allocator *)&s1);
  RaftPkg::RaftPkg(&s1,&f_base,1,&s1_addr);
  RaftPkg::RaftPkg(&s2,&f_base,2,&s2_addr);
  RaftPkg::RaftPkg(&s3,&f_base,3,&s3_addr);
  __l._M_len = 3;
  __l._M_array = (iterator)&local_4e0;
  local_4e0._M_unused._M_object = &s1;
  local_4e0._8_8_ = &s2;
  local_4d0.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)&s3;
  std::vector<RaftPkg_*,_std::allocator<RaftPkg_*>_>::vector(&pkgs,__l,(allocator_type *)&srv);
  iVar5 = launch_servers(&pkgs,(raft_params *)0x0,false);
  if (iVar5 != 0) {
    poVar7 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    poVar7 = std::operator<<(poVar7,"        time: ");
    poVar7 = std::operator<<(poVar7,"\x1b[1;30m");
    TestSuite::getTimeString_abi_cxx11_();
    poVar7 = std::operator<<(poVar7,(string *)local_4e0._M_pod_data);
    poVar7 = std::operator<<(poVar7,"\x1b[0m");
    poVar7 = std::operator<<(poVar7,"\n");
    poVar7 = std::operator<<(poVar7,"      thread: ");
    poVar7 = std::operator<<(poVar7,"\x1b[33m");
    pp_Var1 = poVar7->_vptr_basic_ostream;
    p_Var2 = pp_Var1[-3];
    *(uint *)(&poVar7->field_0x18 + (long)p_Var2) =
         *(uint *)(&poVar7->field_0x18 + (long)p_Var2) & 0xffffffb5 | 8;
    *(undefined8 *)(&poVar7->field_0x10 + (long)pp_Var1[-3]) = 4;
    poVar7 = std::operator<<(poVar7,0x30);
    srv.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)pthread_self();
    std::hash<std::thread::id>::operator()((hash<std::thread::id> *)&req,(id *)&srv);
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    *(uint *)(&poVar7->field_0x18 + (long)poVar7->_vptr_basic_ostream[-3]) =
         *(uint *)(&poVar7->field_0x18 + (long)poVar7->_vptr_basic_ostream[-3]) & 0xffffffb5 | 2;
    poVar7 = std::operator<<(poVar7,"\x1b[0m");
    poVar7 = std::operator<<(poVar7,"\n");
    poVar7 = std::operator<<(poVar7,"          in: ");
    poVar7 = std::operator<<(poVar7,"\x1b[36m");
    poVar7 = std::operator<<(poVar7,"add_node_error_cases_test");
    poVar7 = std::operator<<(poVar7,"()\x1b[0m");
    poVar7 = std::operator<<(poVar7,"\n");
    poVar7 = std::operator<<(poVar7,"          at: ");
    poVar7 = std::operator<<(poVar7,"\x1b[32m");
    poVar7 = std::operator<<(poVar7,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/raft_server_test.cxx"
                            );
    poVar7 = std::operator<<(poVar7,"\x1b[0m:");
    poVar7 = std::operator<<(poVar7,"\x1b[1;35m");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x11a);
    poVar7 = std::operator<<(poVar7,"\x1b[0m");
    poVar7 = std::operator<<(poVar7,"\n");
    poVar7 = std::operator<<(poVar7,"    value of: \x1b[1;34mlaunch_servers( pkgs )\x1b[0m\n");
    poVar7 = std::operator<<(poVar7,"    expected: \x1b[1;32m");
    poVar7 = std::operator<<(poVar7,"0");
    poVar7 = std::operator<<(poVar7,"\x1b[0m\n");
    poVar7 = std::operator<<(poVar7,"      actual: \x1b[1;31m");
    iVar5 = -1;
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,-1);
    std::operator<<(poVar7,"\x1b[0m\n");
    std::__cxx11::string::~string((string *)local_4e0._M_pod_data);
    TestSuite::failHandler();
    goto LAB_00110fdd;
  }
  local_4b8._M_i =
       (long)pkgs.super__Vector_base<RaftPkg_*,_std::allocator<RaftPkg_*>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)pkgs.super__Vector_base<RaftPkg_*,_std::allocator<RaftPkg_*>_>._M_impl.
             super__Vector_impl_data._M_start >> 3;
  if ((int)local_4b8._M_i < 1) {
    poVar7 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    poVar7 = std::operator<<(poVar7,"        time: ");
    poVar7 = std::operator<<(poVar7,"\x1b[1;30m");
    TestSuite::getTimeString_abi_cxx11_();
    poVar7 = std::operator<<(poVar7,(string *)local_4e0._M_pod_data);
    poVar7 = std::operator<<(poVar7,"\x1b[0m");
    poVar7 = std::operator<<(poVar7,"\n");
    poVar7 = std::operator<<(poVar7,"      thread: ");
    poVar7 = std::operator<<(poVar7,"\x1b[33m");
    pp_Var1 = poVar7->_vptr_basic_ostream;
    p_Var2 = pp_Var1[-3];
    *(uint *)(&poVar7->field_0x18 + (long)p_Var2) =
         *(uint *)(&poVar7->field_0x18 + (long)p_Var2) & 0xffffffb5 | 8;
    *(undefined8 *)(&poVar7->field_0x10 + (long)pp_Var1[-3]) = 4;
    poVar7 = std::operator<<(poVar7,0x30);
    srv.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)pthread_self();
    std::hash<std::thread::id>::operator()((hash<std::thread::id> *)&req,(id *)&srv);
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    *(uint *)(&poVar7->field_0x18 + (long)poVar7->_vptr_basic_ostream[-3]) =
         *(uint *)(&poVar7->field_0x18 + (long)poVar7->_vptr_basic_ostream[-3]) & 0xffffffb5 | 2;
    poVar7 = std::operator<<(poVar7,"\x1b[0m");
    poVar7 = std::operator<<(poVar7,"\n");
    poVar7 = std::operator<<(poVar7,"          in: ");
    poVar7 = std::operator<<(poVar7,"\x1b[36m");
    poVar7 = std::operator<<(poVar7,"add_node_error_cases_test");
    poVar7 = std::operator<<(poVar7,"()\x1b[0m");
    poVar7 = std::operator<<(poVar7,"\n");
    poVar7 = std::operator<<(poVar7,"          at: ");
    poVar7 = std::operator<<(poVar7,"\x1b[32m");
    poVar7 = std::operator<<(poVar7,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/raft_server_test.cxx"
                            );
    poVar7 = std::operator<<(poVar7,"\x1b[0m:");
    poVar7 = std::operator<<(poVar7,"\x1b[1;35m");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x11d);
    poVar7 = std::operator<<(poVar7,"\x1b[0m");
    poVar7 = std::operator<<(poVar7,"\n");
    poVar7 = std::operator<<(poVar7,"    expected: ");
    poVar7 = std::operator<<(poVar7,"\x1b[1;34mnum_srvs > 0\x1b[0m\n");
    poVar7 = std::operator<<(poVar7,"    value of ");
    poVar7 = std::operator<<(poVar7,"\x1b[1;32mnum_srvs\x1b[0m: ");
    poVar7 = std::operator<<(poVar7,"\x1b[1;31m");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,(int)local_4b8._M_i);
    poVar7 = std::operator<<(poVar7,"\x1b[0m\n");
    poVar7 = std::operator<<(poVar7,"    value of ");
    poVar7 = std::operator<<(poVar7,"\x1b[1;32m0\x1b[0m: ");
    poVar7 = std::operator<<(poVar7,"\x1b[1;31m");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,0);
    std::operator<<(poVar7,"\x1b[0m\n");
    std::__cxx11::string::~string((string *)local_4e0._M_pod_data);
    TestSuite::failHandler();
    iVar5 = -1;
    goto LAB_00110fdd;
  }
  std::make_shared<nuraft::FakeNetwork,char_const(&)[7],std::shared_ptr<nuraft::FakeNetworkBase>&>
            ((char (*) [7])&c_net,(shared_ptr<nuraft::FakeNetworkBase> *)0x193fe3);
  nuraft::FakeNetworkBase::addNetwork
            (f_base.super___shared_ptr<nuraft::FakeNetworkBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             &c_net);
  (*((c_net.super___shared_ptr<nuraft::FakeNetwork,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    super_rpc_client_factory)._vptr_rpc_client_factory[2])
            (local_438,
             c_net.super___shared_ptr<nuraft::FakeNetwork,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             &s1_addr);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_430);
  (*((c_net.super___shared_ptr<nuraft::FakeNetwork,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    super_rpc_client_factory)._vptr_rpc_client_factory[2])
            (local_448,
             c_net.super___shared_ptr<nuraft::FakeNetwork,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             &s2_addr);
  local_4c0._M_i = 3;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_440);
  local_4e0._M_unused._M_object = &invoked;
  local_4e0._8_8_ = (RaftPkg *)0x0;
  invoked._M_base._M_i = (__atomic_base<bool>)false;
  local_4c8 = std::
              _Function_handler<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/raft_server_test.cxx:293:35)>
              ::_M_invoke;
  srv.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_4d0.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)
       std::
       _Function_handler<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/raft_server_test.cxx:293:35)>
       ::_M_manager;
  log_2.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       CONCAT44(log_2.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_
                ,6);
  local_534 = (undefined1  [4])0x0;
  local_51c = (undefined1  [4])0x0;
  buf.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  log.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  log_1.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::
  make_shared<nuraft::req_msg,unsigned_long,nuraft::msg_type,int,int,unsigned_long,unsigned_long,unsigned_long>
            ((unsigned_long *)&req,(msg_type *)&srv,(int *)&log_2,(int *)local_534,
             (unsigned_long *)local_51c,(unsigned_long *)&buf,(unsigned_long *)&log);
  for (uVar8 = 1; uVar8 < local_4b8._M_i; uVar8 = uVar8 + 1) {
    std::__shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&srv.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2> *)
               ((pkgs.super__Vector_base<RaftPkg_*,_std::allocator<RaftPkg_*>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar8]->sMgr).
                super___shared_ptr<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 8));
    nuraft::srv_config::serialize((srv_config *)&buf);
    log_1.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         ((ulong)log_1.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr &
         0xffffffff00000000);
    log_2.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         CONCAT71(log_2.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
                  _1_7_,3);
    std::make_shared<nuraft::log_entry,int,std::shared_ptr<nuraft::buffer>&,nuraft::log_val_type>
              ((int *)&log,(shared_ptr<nuraft::buffer> *)&log_1,(log_val_type *)&buf);
    std::
    vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
    ::push_back(&(req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 log_entries_,&log);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&log.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&buf.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&srv.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  nuraft::FakeNetwork::findClient
            ((FakeNetwork *)&srv,
             (string *)
             c_net.super___shared_ptr<nuraft::FakeNetwork,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  (**(code **)(*(long *)srv.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr + 0x10))
            (srv.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr,&req,
             &local_4e0,0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&srv.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  srv.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_5a8._0_8_ = local_5a8._0_8_ & 0xffffffffffffff00;
  srv.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_5a8;
  nuraft::FakeNetwork::execReqResp
            (c_net.super___shared_ptr<nuraft::FakeNetwork,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             (string *)&srv);
  std::__cxx11::string::~string((string *)&srv);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  if (((byte)invoked._M_base._M_i & 1) == 0) {
    poVar7 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    poVar7 = std::operator<<(poVar7,"        time: ");
    poVar7 = std::operator<<(poVar7,"\x1b[1;30m");
    TestSuite::getTimeString_abi_cxx11_();
    poVar7 = std::operator<<(poVar7,(string *)&srv);
    poVar7 = std::operator<<(poVar7,"\x1b[0m");
    poVar7 = std::operator<<(poVar7,"\n");
    poVar7 = std::operator<<(poVar7,"      thread: ");
    poVar7 = std::operator<<(poVar7,"\x1b[33m");
    pp_Var1 = poVar7->_vptr_basic_ostream;
    p_Var2 = pp_Var1[-3];
    *(uint *)(&poVar7->field_0x18 + (long)p_Var2) =
         *(uint *)(&poVar7->field_0x18 + (long)p_Var2) & 0xffffffb5 | 8;
    *(undefined8 *)(&poVar7->field_0x10 + (long)pp_Var1[-3]) = 4;
    poVar7 = std::operator<<(poVar7,0x30);
    req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)pthread_self();
    std::hash<std::thread::id>::operator()((hash<std::thread::id> *)&buf,(id *)&req);
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    *(uint *)(&poVar7->field_0x18 + (long)poVar7->_vptr_basic_ostream[-3]) =
         *(uint *)(&poVar7->field_0x18 + (long)poVar7->_vptr_basic_ostream[-3]) & 0xffffffb5 | 2;
    poVar7 = std::operator<<(poVar7,"\x1b[0m");
    poVar7 = std::operator<<(poVar7,"\n");
    poVar7 = std::operator<<(poVar7,"          in: ");
    poVar7 = std::operator<<(poVar7,"\x1b[36m");
    poVar7 = std::operator<<(poVar7,"add_node_error_cases_test");
    poVar7 = std::operator<<(poVar7,"()\x1b[0m");
    poVar7 = std::operator<<(poVar7,"\n");
    poVar7 = std::operator<<(poVar7,"          at: ");
    poVar7 = std::operator<<(poVar7,"\x1b[32m");
    poVar7 = std::operator<<(poVar7,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/raft_server_test.cxx"
                            );
    poVar7 = std::operator<<(poVar7,"\x1b[0m:");
    poVar7 = std::operator<<(poVar7,"\x1b[1;35m");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x13b);
    poVar7 = std::operator<<(poVar7,"\x1b[0m");
    poVar7 = std::operator<<(poVar7,"\n");
    poVar7 = std::operator<<(poVar7,"    value of: \x1b[1;34minvoked.load()\x1b[0m\n");
    poVar7 = std::operator<<(poVar7,"    expected: \x1b[1;32m");
    poVar7 = std::operator<<(poVar7,"true");
    poVar7 = std::operator<<(poVar7,"\x1b[0m\n");
    poVar7 = std::operator<<(poVar7,"      actual: \x1b[1;31m");
    poVar7 = std::operator<<(poVar7,"false");
    std::operator<<(poVar7,"\x1b[0m\n");
LAB_001100a2:
    std::__cxx11::string::~string((string *)&srv);
    TestSuite::failHandler();
LAB_00110fc0:
    iVar5 = -1;
  }
  else {
    LOCK();
    invoked._M_base._M_i = (__atomic_base<bool>)false;
    UNLOCK();
    srv.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_534 = (undefined1  [4])0x0;
    local_51c = (undefined1  [4])0x0;
    buf.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    log.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    log_2.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         CONCAT44(log_2.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
                  _4_4_,6);
    log_1.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    std::
    make_shared<nuraft::req_msg,unsigned_long,nuraft::msg_type,int,int,unsigned_long,unsigned_long,unsigned_long>
              ((unsigned_long *)&req,(msg_type *)&srv,(int *)&log_2,(int *)local_534,
               (unsigned_long *)local_51c,(unsigned_long *)&buf,(unsigned_long *)&log);
    std::__shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2> *)&buf,
               (__shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2> *)
               ((pkgs.super__Vector_base<RaftPkg_*,_std::allocator<RaftPkg_*>_>._M_impl.
                 super__Vector_impl_data._M_start[1]->sMgr).
                super___shared_ptr<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 8));
    nuraft::srv_config::serialize((srv_config *)&log);
    srv.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         ((ulong)srv.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr &
         0xffffffff00000000);
    log_2.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         CONCAT71(log_2.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
                  _1_7_,2);
    std::make_shared<nuraft::log_entry,int,std::shared_ptr<nuraft::buffer>&,nuraft::log_val_type>
              ((int *)&log_1,(shared_ptr<nuraft::buffer> *)&srv,(log_val_type *)&log);
    std::
    vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
    ::push_back(&(req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 log_entries_,&log_1);
    nuraft::FakeNetwork::findClient
              ((FakeNetwork *)&srv,
               (string *)
               c_net.super___shared_ptr<nuraft::FakeNetwork,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    (**(code **)(*(long *)srv.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr + 0x10))
              (srv.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr,&req,
               &local_4e0,0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&srv.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    srv.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_5a8._0_8_ = local_5a8._0_8_ & 0xffffffffffffff00;
    srv.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_5a8;
    nuraft::FakeNetwork::execReqResp
              (c_net.super___shared_ptr<nuraft::FakeNetwork,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               (string *)&srv);
    std::__cxx11::string::~string((string *)&srv);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&log_1.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
    ;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&log.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&buf.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    peVar4 = s1.raftServer.super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    if (((byte)invoked._M_base._M_i & 1) == 0) {
      poVar7 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      poVar7 = std::operator<<(poVar7,"        time: ");
      poVar7 = std::operator<<(poVar7,"\x1b[1;30m");
      TestSuite::getTimeString_abi_cxx11_();
      poVar7 = std::operator<<(poVar7,(string *)&srv);
      poVar7 = std::operator<<(poVar7,"\x1b[0m");
      poVar7 = std::operator<<(poVar7,"\n");
      poVar7 = std::operator<<(poVar7,"      thread: ");
      poVar7 = std::operator<<(poVar7,"\x1b[33m");
      pp_Var1 = poVar7->_vptr_basic_ostream;
      p_Var2 = pp_Var1[-3];
      *(uint *)(&poVar7->field_0x18 + (long)p_Var2) =
           *(uint *)(&poVar7->field_0x18 + (long)p_Var2) & 0xffffffb5 | 8;
      *(undefined8 *)(&poVar7->field_0x10 + (long)pp_Var1[-3]) = 4;
      poVar7 = std::operator<<(poVar7,0x30);
      req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)pthread_self();
      std::hash<std::thread::id>::operator()((hash<std::thread::id> *)&buf,(id *)&req);
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      *(uint *)(&poVar7->field_0x18 + (long)poVar7->_vptr_basic_ostream[-3]) =
           *(uint *)(&poVar7->field_0x18 + (long)poVar7->_vptr_basic_ostream[-3]) & 0xffffffb5 | 2;
      poVar7 = std::operator<<(poVar7,"\x1b[0m");
      poVar7 = std::operator<<(poVar7,"\n");
      poVar7 = std::operator<<(poVar7,"          in: ");
      poVar7 = std::operator<<(poVar7,"\x1b[36m");
      poVar7 = std::operator<<(poVar7,"add_node_error_cases_test");
      poVar7 = std::operator<<(poVar7,"()\x1b[0m");
      poVar7 = std::operator<<(poVar7,"\n");
      poVar7 = std::operator<<(poVar7,"          at: ");
      poVar7 = std::operator<<(poVar7,"\x1b[32m");
      poVar7 = std::operator<<(poVar7,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/raft_server_test.cxx"
                              );
      poVar7 = std::operator<<(poVar7,"\x1b[0m:");
      poVar7 = std::operator<<(poVar7,"\x1b[1;35m");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x14b);
      poVar7 = std::operator<<(poVar7,"\x1b[0m");
      poVar7 = std::operator<<(poVar7,"\n");
      poVar7 = std::operator<<(poVar7,"    value of: \x1b[1;34minvoked.load()\x1b[0m\n");
      poVar7 = std::operator<<(poVar7,"    expected: \x1b[1;32m");
      poVar7 = std::operator<<(poVar7,"true");
      poVar7 = std::operator<<(poVar7,"\x1b[0m\n");
      poVar7 = std::operator<<(poVar7,"      actual: \x1b[1;31m");
      poVar7 = std::operator<<(poVar7,"false");
      std::operator<<(poVar7,"\x1b[0m\n");
      goto LAB_001100a2;
    }
    LOCK();
    invoked._M_base._M_i = (__atomic_base<bool>)false;
    UNLOCK();
    std::__shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&srv.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2> *)
               (s2.sMgr.super___shared_ptr<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 8
               ));
    nuraft::raft_server::add_srv((raft_server *)(local_468 + 0x10),(srv_config *)peVar4);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_450);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&srv.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    peVar4 = s1.raftServer.super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    std::__shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&srv.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2> *)
               (s3.sMgr.super___shared_ptr<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 8
               ));
    nuraft::raft_server::add_srv((raft_server *)&buf,(srv_config *)peVar4);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&srv.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    cVar6 = nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>::
            get_result_code((cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>
                             *)buf.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr);
    if (cVar6 != SERVER_IS_JOINING) {
      poVar7 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      poVar7 = std::operator<<(poVar7,"        time: ");
      poVar7 = std::operator<<(poVar7,"\x1b[1;30m");
      TestSuite::getTimeString_abi_cxx11_();
      poVar7 = std::operator<<(poVar7,(string *)&srv);
      poVar7 = std::operator<<(poVar7,"\x1b[0m");
      poVar7 = std::operator<<(poVar7,"\n");
      poVar7 = std::operator<<(poVar7,"      thread: ");
      poVar7 = std::operator<<(poVar7,"\x1b[33m");
      pp_Var1 = poVar7->_vptr_basic_ostream;
      p_Var2 = pp_Var1[-3];
      *(uint *)(&poVar7->field_0x18 + (long)p_Var2) =
           *(uint *)(&poVar7->field_0x18 + (long)p_Var2) & 0xffffffb5 | 8;
      *(undefined8 *)(&poVar7->field_0x10 + (long)pp_Var1[-3]) = 4;
      poVar7 = std::operator<<(poVar7,0x30);
      req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)pthread_self();
      std::hash<std::thread::id>::operator()((hash<std::thread::id> *)&log,(id *)&req);
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      *(uint *)(&poVar7->field_0x18 + (long)poVar7->_vptr_basic_ostream[-3]) =
           *(uint *)(&poVar7->field_0x18 + (long)poVar7->_vptr_basic_ostream[-3]) & 0xffffffb5 | 2;
      poVar7 = std::operator<<(poVar7,"\x1b[0m");
      poVar7 = std::operator<<(poVar7,"\n");
      poVar7 = std::operator<<(poVar7,"          in: ");
      poVar7 = std::operator<<(poVar7,"\x1b[36m");
      poVar7 = std::operator<<(poVar7,"add_node_error_cases_test");
      poVar7 = std::operator<<(poVar7,"()\x1b[0m");
      poVar7 = std::operator<<(poVar7,"\n");
      poVar7 = std::operator<<(poVar7,"          at: ");
      poVar7 = std::operator<<(poVar7,"\x1b[32m");
      poVar7 = std::operator<<(poVar7,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/raft_server_test.cxx"
                              );
      poVar7 = std::operator<<(poVar7,"\x1b[0m:");
      poVar7 = std::operator<<(poVar7,"\x1b[1;35m");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x158);
      poVar7 = std::operator<<(poVar7,"\x1b[0m");
      poVar7 = std::operator<<(poVar7,"\n");
      poVar7 = std::operator<<(poVar7,"    value of: \x1b[1;34mret->get_result_code()\x1b[0m\n");
      poVar7 = std::operator<<(poVar7,"    expected: \x1b[1;32m");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,-7);
      poVar7 = std::operator<<(poVar7,"\x1b[0m\n");
      poVar7 = std::operator<<(poVar7,"      actual: \x1b[1;31m");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,cVar6);
      std::operator<<(poVar7,"\x1b[0m\n");
      std::__cxx11::string::~string((string *)&srv);
      TestSuite::failHandler();
LAB_00110fb6:
      ppVar3 = &buf;
LAB_00110fbb:
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&(ppVar3->super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>).
                  _M_refcount);
      goto LAB_00110fc0;
    }
    srv.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_5a8._0_8_ = local_5a8._0_8_ & 0xffffffffffffff00;
    srv.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_5a8;
    nuraft::FakeNetwork::execReqResp
              (s1.fNet.super___shared_ptr<nuraft::FakeNetwork,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               (string *)&srv);
    std::__cxx11::string::~string((string *)&srv);
    peVar4 = s1.raftServer.super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    std::__shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2> *)&req,
               (__shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2> *)
               (s3.sMgr.super___shared_ptr<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 8
               ));
    nuraft::raft_server::add_srv((raft_server *)&srv,(srv_config *)peVar4);
    std::
    __shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
    ::operator=((__shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
                 *)&buf,(__shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
                         *)&srv);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&srv.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    cVar6 = nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>::
            get_result_code((cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>
                             *)buf.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr);
    if (cVar6 != OK) {
      cVar6 = nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>
              ::get_result_code((cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>
                                 *)buf.
                                   super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr);
      if (cVar6 != CONFIG_CHANGING) {
        poVar7 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        poVar7 = std::operator<<(poVar7,"        time: ");
        poVar7 = std::operator<<(poVar7,"\x1b[1;30m");
        TestSuite::getTimeString_abi_cxx11_();
        poVar7 = std::operator<<(poVar7,(string *)&srv);
        poVar7 = std::operator<<(poVar7,"\x1b[0m");
        poVar7 = std::operator<<(poVar7,"\n");
        poVar7 = std::operator<<(poVar7,"      thread: ");
        poVar7 = std::operator<<(poVar7,"\x1b[33m");
        pp_Var1 = poVar7->_vptr_basic_ostream;
        p_Var2 = pp_Var1[-3];
        *(uint *)(&poVar7->field_0x18 + (long)p_Var2) =
             *(uint *)(&poVar7->field_0x18 + (long)p_Var2) & 0xffffffb5 | 8;
        *(undefined8 *)(&poVar7->field_0x10 + (long)pp_Var1[-3]) = 4;
        poVar7 = std::operator<<(poVar7,0x30);
        req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)pthread_self();
        std::hash<std::thread::id>::operator()((hash<std::thread::id> *)&log,(id *)&req);
        poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
        *(uint *)(&poVar7->field_0x18 + (long)poVar7->_vptr_basic_ostream[-3]) =
             *(uint *)(&poVar7->field_0x18 + (long)poVar7->_vptr_basic_ostream[-3]) & 0xffffffb5 | 2
        ;
        poVar7 = std::operator<<(poVar7,"\x1b[0m");
        poVar7 = std::operator<<(poVar7,"\n");
        poVar7 = std::operator<<(poVar7,"          in: ");
        poVar7 = std::operator<<(poVar7,"\x1b[36m");
        poVar7 = std::operator<<(poVar7,"add_node_error_cases_test");
        poVar7 = std::operator<<(poVar7,"()\x1b[0m");
        poVar7 = std::operator<<(poVar7,"\n");
        poVar7 = std::operator<<(poVar7,"          at: ");
        poVar7 = std::operator<<(poVar7,"\x1b[32m");
        poVar7 = std::operator<<(poVar7,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/raft_server_test.cxx"
                                );
        poVar7 = std::operator<<(poVar7,"\x1b[0m:");
        poVar7 = std::operator<<(poVar7,"\x1b[1;35m");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x167);
        poVar7 = std::operator<<(poVar7,"\x1b[0m");
        poVar7 = std::operator<<(poVar7,"\n");
        poVar7 = std::operator<<(poVar7,"    value of: \x1b[1;34mret->get_result_code()\x1b[0m\n");
        poVar7 = std::operator<<(poVar7,"    expected: \x1b[1;32m");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,-6);
        poVar7 = std::operator<<(poVar7,"\x1b[0m\n");
        poVar7 = std::operator<<(poVar7,"      actual: \x1b[1;31m");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,cVar6);
        std::operator<<(poVar7,"\x1b[0m\n");
        std::__cxx11::string::~string((string *)&srv);
        TestSuite::failHandler();
        goto LAB_00110fb6;
      }
      local_4c0._M_i = 2;
    }
    srv.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_5a8._0_8_ = local_5a8._0_8_ & 0xffffffffffffff00;
    srv.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_5a8;
    nuraft::FakeNetwork::execReqResp
              (s1.fNet.super___shared_ptr<nuraft::FakeNetwork,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               (string *)&srv);
    std::__cxx11::string::~string((string *)&srv);
    srv.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_5a8._0_8_ = local_5a8._0_8_ & 0xffffffffffffff00;
    psVar9 = (string *)&srv;
    srv.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_5a8;
    nuraft::FakeNetwork::execReqResp
              (s1.fNet.super___shared_ptr<nuraft::FakeNetwork,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               psVar9);
    std::__cxx11::string::~string((string *)&srv);
    iVar5 = wait_for_sm_exec(&pkgs,(size_t)psVar9);
    if (iVar5 != 0) {
      poVar7 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      poVar7 = std::operator<<(poVar7,"        time: ");
      poVar7 = std::operator<<(poVar7,"\x1b[1;30m");
      TestSuite::getTimeString_abi_cxx11_();
      poVar7 = std::operator<<(poVar7,(string *)&srv);
      poVar7 = std::operator<<(poVar7,"\x1b[0m");
      poVar7 = std::operator<<(poVar7,"\n");
      poVar7 = std::operator<<(poVar7,"      thread: ");
      poVar7 = std::operator<<(poVar7,"\x1b[33m");
      pp_Var1 = poVar7->_vptr_basic_ostream;
      p_Var2 = pp_Var1[-3];
      *(uint *)(&poVar7->field_0x18 + (long)p_Var2) =
           *(uint *)(&poVar7->field_0x18 + (long)p_Var2) & 0xffffffb5 | 8;
      *(undefined8 *)(&poVar7->field_0x10 + (long)pp_Var1[-3]) = 4;
      poVar7 = std::operator<<(poVar7,0x30);
      req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)pthread_self();
      std::hash<std::thread::id>::operator()((hash<std::thread::id> *)&log,(id *)&req);
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      *(uint *)(&poVar7->field_0x18 + (long)poVar7->_vptr_basic_ostream[-3]) =
           *(uint *)(&poVar7->field_0x18 + (long)poVar7->_vptr_basic_ostream[-3]) & 0xffffffb5 | 2;
      poVar7 = std::operator<<(poVar7,"\x1b[0m");
      poVar7 = std::operator<<(poVar7,"\n");
      poVar7 = std::operator<<(poVar7,"          in: ");
      poVar7 = std::operator<<(poVar7,"\x1b[36m");
      poVar7 = std::operator<<(poVar7,"add_node_error_cases_test");
      poVar7 = std::operator<<(poVar7,"()\x1b[0m");
      poVar7 = std::operator<<(poVar7,"\n");
      poVar7 = std::operator<<(poVar7,"          at: ");
      poVar7 = std::operator<<(poVar7,"\x1b[32m");
      poVar7 = std::operator<<(poVar7,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/raft_server_test.cxx"
                              );
      poVar7 = std::operator<<(poVar7,"\x1b[0m:");
      poVar7 = std::operator<<(poVar7,"\x1b[1;35m");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x16d);
      poVar7 = std::operator<<(poVar7,"\x1b[0m");
      poVar7 = std::operator<<(poVar7,"\n");
      poVar7 = std::operator<<(poVar7,
                               "    value of: \x1b[1;34mwait_for_sm_exec(pkgs, COMMIT_TIMEOUT_SEC)\x1b[0m\n"
                              );
      poVar7 = std::operator<<(poVar7,"    expected: \x1b[1;32m");
      poVar7 = std::operator<<(poVar7,"0");
      poVar7 = std::operator<<(poVar7,"\x1b[0m\n");
      poVar7 = std::operator<<(poVar7,"      actual: \x1b[1;31m");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,-1);
      std::operator<<(poVar7,"\x1b[0m\n");
      std::__cxx11::string::~string((string *)&srv);
      TestSuite::failHandler();
      goto LAB_00110fb6;
    }
    nuraft::FakeTimer::invoke
              (s1.fTimer.super___shared_ptr<nuraft::FakeTimer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,2)
    ;
    srv.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_5a8._0_8_ = local_5a8._0_8_ & 0xffffffffffffff00;
    srv.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_5a8;
    nuraft::FakeNetwork::execReqResp
              (s1.fNet.super___shared_ptr<nuraft::FakeNetwork,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               (string *)&srv);
    std::__cxx11::string::~string((string *)&srv);
    srv.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_5a8._0_8_ = local_5a8._0_8_ & 0xffffffffffffff00;
    psVar9 = (string *)&srv;
    srv.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_5a8;
    nuraft::FakeNetwork::execReqResp
              (s1.fNet.super___shared_ptr<nuraft::FakeNetwork,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               psVar9);
    std::__cxx11::string::~string((string *)&srv);
    iVar5 = wait_for_sm_exec(&pkgs,(size_t)psVar9);
    if (iVar5 != 0) {
      poVar7 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      poVar7 = std::operator<<(poVar7,"        time: ");
      poVar7 = std::operator<<(poVar7,"\x1b[1;30m");
      TestSuite::getTimeString_abi_cxx11_();
      poVar7 = std::operator<<(poVar7,(string *)&srv);
      poVar7 = std::operator<<(poVar7,"\x1b[0m");
      poVar7 = std::operator<<(poVar7,"\n");
      poVar7 = std::operator<<(poVar7,"      thread: ");
      poVar7 = std::operator<<(poVar7,"\x1b[33m");
      pp_Var1 = poVar7->_vptr_basic_ostream;
      p_Var2 = pp_Var1[-3];
      *(uint *)(&poVar7->field_0x18 + (long)p_Var2) =
           *(uint *)(&poVar7->field_0x18 + (long)p_Var2) & 0xffffffb5 | 8;
      *(undefined8 *)(&poVar7->field_0x10 + (long)pp_Var1[-3]) = 4;
      poVar7 = std::operator<<(poVar7,0x30);
      req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)pthread_self();
      std::hash<std::thread::id>::operator()((hash<std::thread::id> *)&log,(id *)&req);
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      *(uint *)(&poVar7->field_0x18 + (long)poVar7->_vptr_basic_ostream[-3]) =
           *(uint *)(&poVar7->field_0x18 + (long)poVar7->_vptr_basic_ostream[-3]) & 0xffffffb5 | 2;
      poVar7 = std::operator<<(poVar7,"\x1b[0m");
      poVar7 = std::operator<<(poVar7,"\n");
      poVar7 = std::operator<<(poVar7,"          in: ");
      poVar7 = std::operator<<(poVar7,"\x1b[36m");
      poVar7 = std::operator<<(poVar7,"add_node_error_cases_test");
      poVar7 = std::operator<<(poVar7,"()\x1b[0m");
      poVar7 = std::operator<<(poVar7,"\n");
      poVar7 = std::operator<<(poVar7,"          at: ");
      poVar7 = std::operator<<(poVar7,"\x1b[32m");
      poVar7 = std::operator<<(poVar7,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/raft_server_test.cxx"
                              );
      poVar7 = std::operator<<(poVar7,"\x1b[0m:");
      poVar7 = std::operator<<(poVar7,"\x1b[1;35m");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x173);
      poVar7 = std::operator<<(poVar7,"\x1b[0m");
      poVar7 = std::operator<<(poVar7,"\n");
      poVar7 = std::operator<<(poVar7,
                               "    value of: \x1b[1;34mwait_for_sm_exec(pkgs, COMMIT_TIMEOUT_SEC)\x1b[0m\n"
                              );
      poVar7 = std::operator<<(poVar7,"    expected: \x1b[1;32m");
      poVar7 = std::operator<<(poVar7,"0");
      poVar7 = std::operator<<(poVar7,"\x1b[0m\n");
      poVar7 = std::operator<<(poVar7,"      actual: \x1b[1;31m");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,-1);
      std::operator<<(poVar7,"\x1b[0m\n");
      std::__cxx11::string::~string((string *)&srv);
      TestSuite::failHandler();
      goto LAB_00110fb6;
    }
    req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
    ;
    req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_588._M_allocated_capacity = 0;
    nuraft::raft_server::get_srv_config_all
              (s1.raftServer.super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,(vector<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
                       *)&req);
    if (local_4c0._M_i !=
        (long)req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        - (long)req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr >> 4) {
      poVar7 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      poVar7 = std::operator<<(poVar7,"        time: ");
      poVar7 = std::operator<<(poVar7,"\x1b[1;30m");
      TestSuite::getTimeString_abi_cxx11_();
      poVar7 = std::operator<<(poVar7,(string *)&srv);
      poVar7 = std::operator<<(poVar7,"\x1b[0m");
      poVar7 = std::operator<<(poVar7,"\n");
      poVar7 = std::operator<<(poVar7,"      thread: ");
      poVar7 = std::operator<<(poVar7,"\x1b[33m");
      pp_Var1 = poVar7->_vptr_basic_ostream;
      p_Var2 = pp_Var1[-3];
      *(uint *)(&poVar7->field_0x18 + (long)p_Var2) =
           *(uint *)(&poVar7->field_0x18 + (long)p_Var2) & 0xffffffb5 | 8;
      *(undefined8 *)(&poVar7->field_0x10 + (long)pp_Var1[-3]) = 4;
      poVar7 = std::operator<<(poVar7,0x30);
      log.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)pthread_self();
      std::hash<std::thread::id>::operator()((hash<std::thread::id> *)&log_1,(id *)&log);
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      *(uint *)(&poVar7->field_0x18 + (long)poVar7->_vptr_basic_ostream[-3]) =
           *(uint *)(&poVar7->field_0x18 + (long)poVar7->_vptr_basic_ostream[-3]) & 0xffffffb5 | 2;
      poVar7 = std::operator<<(poVar7,"\x1b[0m");
      poVar7 = std::operator<<(poVar7,"\n");
      poVar7 = std::operator<<(poVar7,"          in: ");
      poVar7 = std::operator<<(poVar7,"\x1b[36m");
      poVar7 = std::operator<<(poVar7,"add_node_error_cases_test");
      poVar7 = std::operator<<(poVar7,"()\x1b[0m");
      poVar7 = std::operator<<(poVar7,"\n");
      poVar7 = std::operator<<(poVar7,"          at: ");
      poVar7 = std::operator<<(poVar7,"\x1b[32m");
      poVar7 = std::operator<<(poVar7,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/raft_server_test.cxx"
                              );
      poVar7 = std::operator<<(poVar7,"\x1b[0m:");
      poVar7 = std::operator<<(poVar7,"\x1b[1;35m");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x178);
      poVar7 = std::operator<<(poVar7,"\x1b[0m");
      poVar7 = std::operator<<(poVar7,"\n");
      poVar7 = std::operator<<(poVar7,"    value of: \x1b[1;34mconfigs_out.size()\x1b[0m\n");
      poVar7 = std::operator<<(poVar7,"    expected: \x1b[1;32m");
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      poVar7 = std::operator<<(poVar7,"\x1b[0m\n");
      poVar7 = std::operator<<(poVar7,"      actual: \x1b[1;31m");
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      std::operator<<(poVar7,"\x1b[0m\n");
      std::__cxx11::string::~string((string *)&srv);
      TestSuite::failHandler();
      std::
      vector<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
      ::~vector((vector<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
                 *)&req);
      goto LAB_00110fb6;
    }
    std::
    vector<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
    ::~vector((vector<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
               *)&req);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&buf.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    peVar4 = s1.raftServer.super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    std::__shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&srv.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2> *)
               (s2.sMgr.super___shared_ptr<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 8
               ));
    nuraft::raft_server::add_srv((raft_server *)&req,(srv_config *)peVar4);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&srv.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    cVar6 = nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>::
            get_result_code((cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>
                             *)req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr);
    if (cVar6 != SERVER_ALREADY_EXISTS) {
      poVar7 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      poVar7 = std::operator<<(poVar7,"        time: ");
      poVar7 = std::operator<<(poVar7,"\x1b[1;30m");
      TestSuite::getTimeString_abi_cxx11_();
      poVar7 = std::operator<<(poVar7,(string *)&srv);
      poVar7 = std::operator<<(poVar7,"\x1b[0m");
      poVar7 = std::operator<<(poVar7,"\n");
      poVar7 = std::operator<<(poVar7,"      thread: ");
      poVar7 = std::operator<<(poVar7,"\x1b[33m");
      pp_Var1 = poVar7->_vptr_basic_ostream;
      p_Var2 = pp_Var1[-3];
      *(uint *)(&poVar7->field_0x18 + (long)p_Var2) =
           *(uint *)(&poVar7->field_0x18 + (long)p_Var2) & 0xffffffb5 | 8;
      *(undefined8 *)(&poVar7->field_0x10 + (long)pp_Var1[-3]) = 4;
      poVar7 = std::operator<<(poVar7,0x30);
      buf.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)pthread_self();
      std::hash<std::thread::id>::operator()((hash<std::thread::id> *)&log,(id *)&buf);
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      *(uint *)(&poVar7->field_0x18 + (long)poVar7->_vptr_basic_ostream[-3]) =
           *(uint *)(&poVar7->field_0x18 + (long)poVar7->_vptr_basic_ostream[-3]) & 0xffffffb5 | 2;
      poVar7 = std::operator<<(poVar7,"\x1b[0m");
      poVar7 = std::operator<<(poVar7,"\n");
      poVar7 = std::operator<<(poVar7,"          in: ");
      poVar7 = std::operator<<(poVar7,"\x1b[36m");
      poVar7 = std::operator<<(poVar7,"add_node_error_cases_test");
      poVar7 = std::operator<<(poVar7,"()\x1b[0m");
      poVar7 = std::operator<<(poVar7,"\n");
      poVar7 = std::operator<<(poVar7,"          at: ");
      poVar7 = std::operator<<(poVar7,"\x1b[32m");
      poVar7 = std::operator<<(poVar7,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/raft_server_test.cxx"
                              );
      poVar7 = std::operator<<(poVar7,"\x1b[0m:");
      poVar7 = std::operator<<(poVar7,"\x1b[1;35m");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x17e);
      poVar7 = std::operator<<(poVar7,"\x1b[0m");
      poVar7 = std::operator<<(poVar7,"\n");
      poVar7 = std::operator<<(poVar7,"    value of: \x1b[1;34mret->get_result_code()\x1b[0m\n");
      poVar7 = std::operator<<(poVar7,"    expected: \x1b[1;32m");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,-5);
      poVar7 = std::operator<<(poVar7,"\x1b[0m\n");
      poVar7 = std::operator<<(poVar7,"      actual: \x1b[1;31m");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,cVar6);
      std::operator<<(poVar7,"\x1b[0m\n");
      std::__cxx11::string::~string((string *)&srv);
      TestSuite::failHandler();
LAB_001114c8:
      ppVar3 = (ptr<buffer> *)&req;
      goto LAB_00110fbb;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    peVar4 = s2.raftServer.super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    std::__shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&srv.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2> *)
               (s3.sMgr.super___shared_ptr<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 8
               ));
    nuraft::raft_server::add_srv((raft_server *)&req,(srv_config *)peVar4);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&srv.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    cVar6 = nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>::
            get_result_code((cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>
                             *)req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr);
    if (cVar6 != NOT_LEADER) {
      poVar7 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      poVar7 = std::operator<<(poVar7,"        time: ");
      poVar7 = std::operator<<(poVar7,"\x1b[1;30m");
      TestSuite::getTimeString_abi_cxx11_();
      poVar7 = std::operator<<(poVar7,(string *)&srv);
      poVar7 = std::operator<<(poVar7,"\x1b[0m");
      poVar7 = std::operator<<(poVar7,"\n");
      poVar7 = std::operator<<(poVar7,"      thread: ");
      poVar7 = std::operator<<(poVar7,"\x1b[33m");
      pp_Var1 = poVar7->_vptr_basic_ostream;
      p_Var2 = pp_Var1[-3];
      *(uint *)(&poVar7->field_0x18 + (long)p_Var2) =
           *(uint *)(&poVar7->field_0x18 + (long)p_Var2) & 0xffffffb5 | 8;
      *(undefined8 *)(&poVar7->field_0x10 + (long)pp_Var1[-3]) = 4;
      poVar7 = std::operator<<(poVar7,0x30);
      buf.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)pthread_self();
      std::hash<std::thread::id>::operator()((hash<std::thread::id> *)&log,(id *)&buf);
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      *(uint *)(&poVar7->field_0x18 + (long)poVar7->_vptr_basic_ostream[-3]) =
           *(uint *)(&poVar7->field_0x18 + (long)poVar7->_vptr_basic_ostream[-3]) & 0xffffffb5 | 2;
      poVar7 = std::operator<<(poVar7,"\x1b[0m");
      poVar7 = std::operator<<(poVar7,"\n");
      poVar7 = std::operator<<(poVar7,"          in: ");
      poVar7 = std::operator<<(poVar7,"\x1b[36m");
      poVar7 = std::operator<<(poVar7,"add_node_error_cases_test");
      poVar7 = std::operator<<(poVar7,"()\x1b[0m");
      poVar7 = std::operator<<(poVar7,"\n");
      poVar7 = std::operator<<(poVar7,"          at: ");
      poVar7 = std::operator<<(poVar7,"\x1b[32m");
      poVar7 = std::operator<<(poVar7,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/raft_server_test.cxx"
                              );
      poVar7 = std::operator<<(poVar7,"\x1b[0m:");
      poVar7 = std::operator<<(poVar7,"\x1b[1;35m");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x184);
      poVar7 = std::operator<<(poVar7,"\x1b[0m");
      poVar7 = std::operator<<(poVar7,"\n");
      poVar7 = std::operator<<(poVar7,"    value of: \x1b[1;34mret->get_result_code()\x1b[0m\n");
      poVar7 = std::operator<<(poVar7,"    expected: \x1b[1;32m");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,-3);
      poVar7 = std::operator<<(poVar7,"\x1b[0m\n");
      poVar7 = std::operator<<(poVar7,"      actual: \x1b[1;31m");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,cVar6);
      std::operator<<(poVar7,"\x1b[0m\n");
      std::__cxx11::string::~string((string *)&srv);
      TestSuite::failHandler();
      goto LAB_001114c8;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    srv.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    srv.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)&invoked;
    local_5a8._8_8_ =
         std::
         _Function_handler<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/raft_server_test.cxx:391:30)>
         ::_M_invoke;
    local_5a8._0_8_ =
         std::
         _Function_handler<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/raft_server_test.cxx:391:30)>
         ::_M_manager;
    req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
    ;
    local_51c = (undefined1  [4])0x0;
    local_4ac = 0;
    log.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    log_1.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_534 = (undefined1  [4])0x6;
    log_2.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    std::
    make_shared<nuraft::req_msg,unsigned_long,nuraft::msg_type,int,int,unsigned_long,unsigned_long,unsigned_long>
              ((unsigned_long *)&buf,(msg_type *)&req,(int *)local_534,(int *)local_51c,
               (unsigned_long *)&local_4ac,(unsigned_long *)&log,(unsigned_long *)&log_1);
    std::__shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2> *)&log,
               (__shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2> *)
               (s3.sMgr.super___shared_ptr<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 8
               ));
    nuraft::srv_config::serialize((srv_config *)&log_1);
    req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         ((ulong)req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr &
         0xffffffff00000000);
    local_534[0] = 3;
    std::make_shared<nuraft::log_entry,int,std::shared_ptr<nuraft::buffer>&,nuraft::log_val_type>
              ((int *)&log_2,(shared_ptr<nuraft::buffer> *)&req,(log_val_type *)&log_1);
    std::
    vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
    ::push_back((vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                 *)(buf.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 0x38
                   ),&log_2);
    nuraft::FakeNetwork::findClient
              ((FakeNetwork *)&req,
               (string *)
               c_net.super___shared_ptr<nuraft::FakeNetwork,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    (*((req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->super_msg_base)
      ._vptr_msg_base[2])
              (req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr,&buf,&srv,
               0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_588._M_allocated_capacity = local_588._M_allocated_capacity & 0xffffffffffffff00;
    req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)&local_588;
    nuraft::FakeNetwork::execReqResp
              (c_net.super___shared_ptr<nuraft::FakeNetwork,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               (string *)&req);
    std::__cxx11::string::~string((string *)&req);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&log_2.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
    ;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&log_1.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
    ;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&log.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&buf.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    peVar4 = s1.raftServer.super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    if (((byte)invoked._M_base._M_i & 1) == 0) {
      poVar7 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      poVar7 = std::operator<<(poVar7,"        time: ");
      poVar7 = std::operator<<(poVar7,"\x1b[1;30m");
      TestSuite::getTimeString_abi_cxx11_();
      poVar7 = std::operator<<(poVar7,(string *)&req);
      poVar7 = std::operator<<(poVar7,"\x1b[0m");
      poVar7 = std::operator<<(poVar7,"\n");
      poVar7 = std::operator<<(poVar7,"      thread: ");
      poVar7 = std::operator<<(poVar7,"\x1b[33m");
      pp_Var1 = poVar7->_vptr_basic_ostream;
      p_Var2 = pp_Var1[-3];
      *(uint *)(&poVar7->field_0x18 + (long)p_Var2) =
           *(uint *)(&poVar7->field_0x18 + (long)p_Var2) & 0xffffffb5 | 8;
      *(undefined8 *)(&poVar7->field_0x10 + (long)pp_Var1[-3]) = 4;
      poVar7 = std::operator<<(poVar7,0x30);
      buf.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)pthread_self();
      std::hash<std::thread::id>::operator()((hash<std::thread::id> *)&log,(id *)&buf);
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      *(uint *)(&poVar7->field_0x18 + (long)poVar7->_vptr_basic_ostream[-3]) =
           *(uint *)(&poVar7->field_0x18 + (long)poVar7->_vptr_basic_ostream[-3]) & 0xffffffb5 | 2;
      poVar7 = std::operator<<(poVar7,"\x1b[0m");
      poVar7 = std::operator<<(poVar7,"\n");
      poVar7 = std::operator<<(poVar7,"          in: ");
      poVar7 = std::operator<<(poVar7,"\x1b[36m");
      poVar7 = std::operator<<(poVar7,"add_node_error_cases_test");
      poVar7 = std::operator<<(poVar7,"()\x1b[0m");
      poVar7 = std::operator<<(poVar7,"\n");
      poVar7 = std::operator<<(poVar7,"          at: ");
      poVar7 = std::operator<<(poVar7,"\x1b[32m");
      poVar7 = std::operator<<(poVar7,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/raft_server_test.cxx"
                              );
      poVar7 = std::operator<<(poVar7,"\x1b[0m:");
      poVar7 = std::operator<<(poVar7,"\x1b[1;35m");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x199);
      poVar7 = std::operator<<(poVar7,"\x1b[0m");
      poVar7 = std::operator<<(poVar7,"\n");
      poVar7 = std::operator<<(poVar7,"    value of: \x1b[1;34minvoked.load()\x1b[0m\n");
      poVar7 = std::operator<<(poVar7,"    expected: \x1b[1;32m");
      poVar7 = std::operator<<(poVar7,"true");
      poVar7 = std::operator<<(poVar7,"\x1b[0m\n");
      poVar7 = std::operator<<(poVar7,"      actual: \x1b[1;31m");
      poVar7 = std::operator<<(poVar7,"false");
      std::operator<<(poVar7,"\x1b[0m\n");
      std::__cxx11::string::~string((string *)&req);
      TestSuite::failHandler();
LAB_00111710:
      iVar5 = -1;
    }
    else {
      LOCK();
      invoked._M_base._M_i = (__atomic_base<bool>)false;
      UNLOCK();
      std::__shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2> *)&req,
                 (__shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2> *)
                 (s3.sMgr.super___shared_ptr<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
                 8));
      nuraft::raft_server::add_srv((raft_server *)local_468,(srv_config *)peVar4);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_468 + 8));
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_588._M_allocated_capacity = local_588._M_allocated_capacity & 0xffffffffffffff00;
      req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)&local_588;
      nuraft::FakeNetwork::execReqResp
                (s1.fNet.super___shared_ptr<nuraft::FakeNetwork,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 (string *)&req);
      std::__cxx11::string::~string((string *)&req);
      req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_588._M_allocated_capacity = local_588._M_allocated_capacity & 0xffffffffffffff00;
      psVar9 = (string *)&req;
      req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)&local_588;
      nuraft::FakeNetwork::execReqResp
                (s1.fNet.super___shared_ptr<nuraft::FakeNetwork,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 psVar9);
      std::__cxx11::string::~string((string *)&req);
      iVar5 = wait_for_sm_exec(&pkgs,(size_t)psVar9);
      if (iVar5 == 0) {
        nuraft::FakeTimer::invoke
                  (s1.fTimer.super___shared_ptr<nuraft::FakeTimer,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr,2);
        req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_588._M_allocated_capacity = local_588._M_allocated_capacity & 0xffffffffffffff00;
        req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)&local_588;
        nuraft::FakeNetwork::execReqResp
                  (s1.fNet.super___shared_ptr<nuraft::FakeNetwork,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr,(string *)&req);
        std::__cxx11::string::~string((string *)&req);
        req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_588._M_allocated_capacity = local_588._M_allocated_capacity & 0xffffffffffffff00;
        psVar9 = (string *)&req;
        req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)&local_588;
        nuraft::FakeNetwork::execReqResp
                  (s1.fNet.super___shared_ptr<nuraft::FakeNetwork,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr,psVar9);
        std::__cxx11::string::~string((string *)&req);
        iVar5 = wait_for_sm_exec(&pkgs,(size_t)psVar9);
        if (iVar5 == 0) {
          configs_out = (vector<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
                         *)&buf;
          buf.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          buf.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          nuraft::raft_server::get_srv_config_all
                    (s1.raftServer.
                     super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                     configs_out);
          __fd = (int)configs_out;
          iVar5 = (int)((ulong)((long)buf.
                                      super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount._M_pi -
                               (long)buf.
                                     super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                                     _M_ptr) >> 4);
          if (iVar5 != 3) {
            poVar7 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
            poVar7 = std::operator<<(poVar7,"        time: ");
            poVar7 = std::operator<<(poVar7,"\x1b[1;30m");
            TestSuite::getTimeString_abi_cxx11_();
            poVar7 = std::operator<<(poVar7,(string *)&req);
            poVar7 = std::operator<<(poVar7,"\x1b[0m");
            poVar7 = std::operator<<(poVar7,"\n");
            poVar7 = std::operator<<(poVar7,"      thread: ");
            poVar7 = std::operator<<(poVar7,"\x1b[33m");
            pp_Var1 = poVar7->_vptr_basic_ostream;
            p_Var2 = pp_Var1[-3];
            *(uint *)(&poVar7->field_0x18 + (long)p_Var2) =
                 *(uint *)(&poVar7->field_0x18 + (long)p_Var2) & 0xffffffb5 | 8;
            *(undefined8 *)(&poVar7->field_0x10 + (long)pp_Var1[-3]) = 4;
            poVar7 = std::operator<<(poVar7,0x30);
            log.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)pthread_self();
            std::hash<std::thread::id>::operator()((hash<std::thread::id> *)&log_1,(id *)&log);
            poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
            *(uint *)(&poVar7->field_0x18 + (long)poVar7->_vptr_basic_ostream[-3]) =
                 *(uint *)(&poVar7->field_0x18 + (long)poVar7->_vptr_basic_ostream[-3]) & 0xffffffb5
                 | 2;
            poVar7 = std::operator<<(poVar7,"\x1b[0m");
            poVar7 = std::operator<<(poVar7,"\n");
            poVar7 = std::operator<<(poVar7,"          in: ");
            poVar7 = std::operator<<(poVar7,"\x1b[36m");
            poVar7 = std::operator<<(poVar7,"add_node_error_cases_test");
            poVar7 = std::operator<<(poVar7,"()\x1b[0m");
            poVar7 = std::operator<<(poVar7,"\n");
            poVar7 = std::operator<<(poVar7,"          at: ");
            poVar7 = std::operator<<(poVar7,"\x1b[32m");
            poVar7 = std::operator<<(poVar7,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/raft_server_test.cxx"
                                    );
            poVar7 = std::operator<<(poVar7,"\x1b[0m:");
            poVar7 = std::operator<<(poVar7,"\x1b[1;35m");
            poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x1ac);
            poVar7 = std::operator<<(poVar7,"\x1b[0m");
            poVar7 = std::operator<<(poVar7,"\n");
            poVar7 = std::operator<<(poVar7,"    value of: \x1b[1;34mconfigs_out.size()\x1b[0m\n");
            poVar7 = std::operator<<(poVar7,"    expected: \x1b[1;32m");
            poVar7 = (ostream *)std::ostream::operator<<(poVar7,3);
            poVar7 = std::operator<<(poVar7,"\x1b[0m\n");
            poVar7 = std::operator<<(poVar7,"      actual: \x1b[1;31m");
            poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar5);
            std::operator<<(poVar7,"\x1b[0m\n");
            std::__cxx11::string::~string((string *)&req);
            TestSuite::failHandler();
            std::
            vector<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
            ::~vector((vector<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
                       *)&buf);
            goto LAB_00111710;
          }
          std::
          vector<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
          ::~vector((vector<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
                     *)&buf);
          print_stats(&pkgs);
          nuraft::raft_server::shutdown
                    (s1.raftServer.
                     super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr,__fd
                     ,__how);
          nuraft::raft_server::shutdown
                    (s2.raftServer.
                     super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr,__fd
                     ,__how_00);
          nuraft::raft_server::shutdown
                    (s3.raftServer.
                     super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr,__fd
                     ,__how_01);
          iVar5 = 0;
          nuraft::FakeNetworkBase::destroy
                    (f_base.super___shared_ptr<nuraft::FakeNetworkBase,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
        }
        else {
          poVar7 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
          poVar7 = std::operator<<(poVar7,"        time: ");
          poVar7 = std::operator<<(poVar7,"\x1b[1;30m");
          TestSuite::getTimeString_abi_cxx11_();
          poVar7 = std::operator<<(poVar7,(string *)&req);
          poVar7 = std::operator<<(poVar7,"\x1b[0m");
          poVar7 = std::operator<<(poVar7,"\n");
          poVar7 = std::operator<<(poVar7,"      thread: ");
          poVar7 = std::operator<<(poVar7,"\x1b[33m");
          pp_Var1 = poVar7->_vptr_basic_ostream;
          p_Var2 = pp_Var1[-3];
          *(uint *)(&poVar7->field_0x18 + (long)p_Var2) =
               *(uint *)(&poVar7->field_0x18 + (long)p_Var2) & 0xffffffb5 | 8;
          *(undefined8 *)(&poVar7->field_0x10 + (long)pp_Var1[-3]) = 4;
          poVar7 = std::operator<<(poVar7,0x30);
          buf.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)pthread_self();
          std::hash<std::thread::id>::operator()((hash<std::thread::id> *)&log,(id *)&buf);
          poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
          *(uint *)(&poVar7->field_0x18 + (long)poVar7->_vptr_basic_ostream[-3]) =
               *(uint *)(&poVar7->field_0x18 + (long)poVar7->_vptr_basic_ostream[-3]) & 0xffffffb5 |
               2;
          poVar7 = std::operator<<(poVar7,"\x1b[0m");
          poVar7 = std::operator<<(poVar7,"\n");
          poVar7 = std::operator<<(poVar7,"          in: ");
          poVar7 = std::operator<<(poVar7,"\x1b[36m");
          poVar7 = std::operator<<(poVar7,"add_node_error_cases_test");
          poVar7 = std::operator<<(poVar7,"()\x1b[0m");
          poVar7 = std::operator<<(poVar7,"\n");
          poVar7 = std::operator<<(poVar7,"          at: ");
          poVar7 = std::operator<<(poVar7,"\x1b[32m");
          poVar7 = std::operator<<(poVar7,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/raft_server_test.cxx"
                                  );
          poVar7 = std::operator<<(poVar7,"\x1b[0m:");
          poVar7 = std::operator<<(poVar7,"\x1b[1;35m");
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x1a6);
          poVar7 = std::operator<<(poVar7,"\x1b[0m");
          poVar7 = std::operator<<(poVar7,"\n");
          poVar7 = std::operator<<(poVar7,
                                   "    value of: \x1b[1;34mwait_for_sm_exec(pkgs, COMMIT_TIMEOUT_SEC)\x1b[0m\n"
                                  );
          poVar7 = std::operator<<(poVar7,"    expected: \x1b[1;32m");
          poVar7 = std::operator<<(poVar7,"0");
          poVar7 = std::operator<<(poVar7,"\x1b[0m\n");
          poVar7 = std::operator<<(poVar7,"      actual: \x1b[1;31m");
          iVar5 = -1;
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,-1);
          std::operator<<(poVar7,"\x1b[0m\n");
          std::__cxx11::string::~string((string *)&req);
          TestSuite::failHandler();
        }
      }
      else {
        poVar7 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        poVar7 = std::operator<<(poVar7,"        time: ");
        poVar7 = std::operator<<(poVar7,"\x1b[1;30m");
        TestSuite::getTimeString_abi_cxx11_();
        poVar7 = std::operator<<(poVar7,(string *)&req);
        poVar7 = std::operator<<(poVar7,"\x1b[0m");
        poVar7 = std::operator<<(poVar7,"\n");
        poVar7 = std::operator<<(poVar7,"      thread: ");
        poVar7 = std::operator<<(poVar7,"\x1b[33m");
        pp_Var1 = poVar7->_vptr_basic_ostream;
        p_Var2 = pp_Var1[-3];
        *(uint *)(&poVar7->field_0x18 + (long)p_Var2) =
             *(uint *)(&poVar7->field_0x18 + (long)p_Var2) & 0xffffffb5 | 8;
        *(undefined8 *)(&poVar7->field_0x10 + (long)pp_Var1[-3]) = 4;
        poVar7 = std::operator<<(poVar7,0x30);
        buf.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)pthread_self();
        std::hash<std::thread::id>::operator()((hash<std::thread::id> *)&log,(id *)&buf);
        poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
        *(uint *)(&poVar7->field_0x18 + (long)poVar7->_vptr_basic_ostream[-3]) =
             *(uint *)(&poVar7->field_0x18 + (long)poVar7->_vptr_basic_ostream[-3]) & 0xffffffb5 | 2
        ;
        poVar7 = std::operator<<(poVar7,"\x1b[0m");
        poVar7 = std::operator<<(poVar7,"\n");
        poVar7 = std::operator<<(poVar7,"          in: ");
        poVar7 = std::operator<<(poVar7,"\x1b[36m");
        poVar7 = std::operator<<(poVar7,"add_node_error_cases_test");
        poVar7 = std::operator<<(poVar7,"()\x1b[0m");
        poVar7 = std::operator<<(poVar7,"\n");
        poVar7 = std::operator<<(poVar7,"          at: ");
        poVar7 = std::operator<<(poVar7,"\x1b[32m");
        poVar7 = std::operator<<(poVar7,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/raft_server_test.cxx"
                                );
        poVar7 = std::operator<<(poVar7,"\x1b[0m:");
        poVar7 = std::operator<<(poVar7,"\x1b[1;35m");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x1a0);
        poVar7 = std::operator<<(poVar7,"\x1b[0m");
        poVar7 = std::operator<<(poVar7,"\n");
        poVar7 = std::operator<<(poVar7,
                                 "    value of: \x1b[1;34mwait_for_sm_exec(pkgs, COMMIT_TIMEOUT_SEC)\x1b[0m\n"
                                );
        poVar7 = std::operator<<(poVar7,"    expected: \x1b[1;32m");
        poVar7 = std::operator<<(poVar7,"0");
        poVar7 = std::operator<<(poVar7,"\x1b[0m\n");
        poVar7 = std::operator<<(poVar7,"      actual: \x1b[1;31m");
        iVar5 = -1;
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,-1);
        std::operator<<(poVar7,"\x1b[0m\n");
        std::__cxx11::string::~string((string *)&req);
        TestSuite::failHandler();
      }
    }
    std::_Function_base::~_Function_base((_Function_base *)&srv);
  }
  std::_Function_base::~_Function_base((_Function_base *)&local_4e0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&c_net.super___shared_ptr<nuraft::FakeNetwork,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
LAB_00110fdd:
  std::_Vector_base<RaftPkg_*,_std::allocator<RaftPkg_*>_>::~_Vector_base
            (&pkgs.super__Vector_base<RaftPkg_*,_std::allocator<RaftPkg_*>_>);
  RaftPkg::~RaftPkg(&s3);
  RaftPkg::~RaftPkg(&s2);
  RaftPkg::~RaftPkg(&s1);
  std::__cxx11::string::~string((string *)&s3_addr);
  std::__cxx11::string::~string((string *)&s2_addr);
  std::__cxx11::string::~string((string *)&s1_addr);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&f_base.super___shared_ptr<nuraft::FakeNetworkBase,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return iVar5;
}

Assistant:

int add_node_error_cases_test() {
    reset_log_files();
    ptr<FakeNetworkBase> f_base = cs_new<FakeNetworkBase>();

    std::string s1_addr = "S1";
    std::string s2_addr = "S2";
    std::string s3_addr = "S3";

    RaftPkg s1(f_base, 1, s1_addr);
    RaftPkg s2(f_base, 2, s2_addr);
    RaftPkg s3(f_base, 3, s3_addr);
    std::vector<RaftPkg*> pkgs = {&s1, &s2, &s3};

    CHK_Z( launch_servers( pkgs ) );

    size_t num_srvs = pkgs.size();
    CHK_GT(num_srvs, 0);

    ptr<FakeNetwork> c_net = cs_new<FakeNetwork>("client", f_base);
    f_base->addNetwork(c_net);
    c_net->create_client(s1_addr);
    c_net->create_client(s2_addr);

    std::atomic<bool> invoked(false);
    rpc_handler bad_req_handler = [&invoked]( ptr<resp_msg>& resp,
                                              ptr<rpc_exception>& err ) -> int {
        invoked.store(true);
        CHK_EQ( cmd_result_code::BAD_REQUEST, resp->get_result_code() );
        return 0;
    };

    {   // Attempt to add more than one server at once.
        ptr<req_msg> req = cs_new<req_msg>
                           ( (ulong)0, msg_type::add_server_request, 0, 0,
                             (ulong)0, (ulong)0, (ulong)0 );
        for (size_t ii=1; ii<num_srvs; ++ii) {
            RaftPkg* ff = pkgs[ii];
            ptr<srv_config> srv = ff->getTestMgr()->get_srv_config();
            ptr<buffer> buf(srv->serialize());
            ptr<log_entry> log( cs_new<log_entry>
                                ( 0, buf, log_val_type::cluster_server ) );
            req->log_entries().push_back(log);
        }
        c_net->findClient(s1_addr)->send( req, bad_req_handler );
        c_net->execReqResp();
    }
    CHK_TRUE(invoked.load());
    invoked = false;

    {   // Attempt to add server with wrong message type.
        ptr<req_msg> req = cs_new<req_msg>
                           ( (ulong)0, msg_type::add_server_request, 0, 0,
                             (ulong)0, (ulong)0, (ulong)0 );
        RaftPkg* ff = pkgs[1];
        ptr<srv_config> srv = ff->getTestMgr()->get_srv_config();
        ptr<buffer> buf(srv->serialize());
        ptr<log_entry> log( cs_new<log_entry>
                            ( 0, buf, log_val_type::conf ) );
        req->log_entries().push_back(log);
        c_net->findClient(s1_addr)->send( req, bad_req_handler );
        c_net->execReqResp();
    }
    CHK_TRUE(invoked.load());
    invoked = false;

    {   // Attempt to add server while previous one is in progress.

        // Add S2 to S1.
        s1.raftServer->add_srv( *(s2.getTestMgr()->get_srv_config()) );

        // Now adding S2 is in progress, add S3 to S1.
        ptr<raft_result> ret =
            s1.raftServer->add_srv( *(s3.getTestMgr()->get_srv_config()) );

        // Should fail.
        CHK_EQ( cmd_result_code::SERVER_IS_JOINING, ret->get_result_code() );

        // Join req/resp.
        s1.fNet->execReqResp();

        // Now config change is in progress, add S3 to S1.
        ret = s1.raftServer->add_srv( *(s3.getTestMgr()->get_srv_config()) );

        // May fail (depends on commit thread wake-up timing).
        size_t expected_cluster_size = 2;
        if (ret->get_result_code() == cmd_result_code::OK) {
            // If succeed, S3 is also a member of group.
            expected_cluster_size = 3;
        } else {
            // If not, error code should be CONFIG_CHANGNING.
            CHK_EQ( cmd_result_code::CONFIG_CHANGING, ret->get_result_code() );
        }

        // Finish adding S2 task.
        s1.fNet->execReqResp();
        s1.fNet->execReqResp();
        CHK_Z( wait_for_sm_exec(pkgs, COMMIT_TIMEOUT_SEC) );

        // Heartbeat.
        s1.fTimer->invoke( timer_task_type::heartbeat_timer );
        s1.fNet->execReqResp();
        s1.fNet->execReqResp();
        CHK_Z( wait_for_sm_exec(pkgs, COMMIT_TIMEOUT_SEC) );

        std::vector< ptr< srv_config > > configs_out;
        s1.raftServer->get_srv_config_all(configs_out);

        CHK_EQ(expected_cluster_size, configs_out.size());
    }

    {   // Attempt to add S2 again.
        ptr<raft_result> ret =
            s1.raftServer->add_srv( *(s2.getTestMgr()->get_srv_config()) );
        CHK_EQ( cmd_result_code::SERVER_ALREADY_EXISTS, ret->get_result_code() );
    }

    {   // Attempt to add S3 to S2 (non-leader).
        ptr<raft_result> ret =
            s2.raftServer->add_srv( *(s3.getTestMgr()->get_srv_config()) );
        CHK_EQ( cmd_result_code::NOT_LEADER, ret->get_result_code() );
    }

    rpc_handler nl_handler = [&invoked]( ptr<resp_msg>& resp,
                                         ptr<rpc_exception>& err ) -> int {
        invoked.store(true);
        CHK_EQ( cmd_result_code::NOT_LEADER, resp->get_result_code() );
        return 0;
    };
    {   // Attempt to add S3 to S2 (non-leader), through RPC.
        ptr<req_msg> req = cs_new<req_msg>
                           ( (ulong)0, msg_type::add_server_request, 0, 0,
                             (ulong)0, (ulong)0, (ulong)0 );
        ptr<srv_config> srv = s3.getTestMgr()->get_srv_config();
        ptr<buffer> buf(srv->serialize());
        ptr<log_entry> log( cs_new<log_entry>
                            ( 0, buf, log_val_type::cluster_server ) );
        req->log_entries().push_back(log);
        c_net->findClient(s2_addr)->send( req, nl_handler );
        c_net->execReqResp();
    }
    CHK_TRUE(invoked.load());
    invoked = false;

    {   // Now, normally add S3 to S1.
        s1.raftServer->add_srv( *(s3.getTestMgr()->get_srv_config()) );
        s1.fNet->execReqResp();
        s1.fNet->execReqResp();
        CHK_Z( wait_for_sm_exec(pkgs, COMMIT_TIMEOUT_SEC) );

        // Heartbeat.
        s1.fTimer->invoke( timer_task_type::heartbeat_timer );
        s1.fNet->execReqResp();
        s1.fNet->execReqResp();
        CHK_Z( wait_for_sm_exec(pkgs, COMMIT_TIMEOUT_SEC) );

        std::vector< ptr< srv_config > > configs_out;
        s1.raftServer->get_srv_config_all(configs_out);

        // All 3 servers should exist.
        CHK_EQ(3, configs_out.size());
    }

    print_stats(pkgs);

    s1.raftServer->shutdown();
    s2.raftServer->shutdown();
    s3.raftServer->shutdown();

    f_base->destroy();

    return 0;
}